

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

int __thiscall
google::protobuf::internal::EpsCopyInputStream::BytesAvailable(EpsCopyInputStream *this,char *ptr)

{
  char *pcVar1;
  
  if (ptr == (char *)0x0) {
    BytesAvailable();
  }
  else {
    pcVar1 = this->buffer_end_ + (0x10 - (long)ptr);
    if (-1 < (long)pcVar1) {
      if (pcVar1 < (char *)0x80000000) {
        return (int)pcVar1;
      }
      goto LAB_001fb016;
    }
  }
  BytesAvailable();
LAB_001fb016:
  BytesAvailable();
}

Assistant:

int BytesAvailable(const char* ptr) const {
    ABSL_DCHECK_NE(ptr, nullptr);
    ptrdiff_t available = buffer_end_ + kSlopBytes - ptr;
    ABSL_DCHECK_GE(available, 0);
    ABSL_DCHECK_LE(available, INT_MAX);
    return static_cast<int>(available);
  }